

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
fasttext::Model::Model
          (Model *this,shared_ptr<fasttext::Matrix> *wi,shared_ptr<fasttext::Matrix> *wo,
          shared_ptr<fasttext::Args> *args,int32_t seed)

{
  undefined1 auVar1 [32];
  
  (this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->wi_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->wi_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Vector::Vector(&this->hidden_,
                 (long)((args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->dim);
  Vector::Vector(&this->output_,
                 ((wo->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_
                );
  Vector::Vector(&this->grad_,
                 (long)((args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->dim);
  (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  auVar1 = ZEXT432(0) << 0x40;
  this->paths = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )auVar1._0_24_;
  (this->codes).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar1._24_8_;
  *(undefined1 (*) [32])
   &(this->codes).
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar1;
  (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rng)._M_x = (ulong)(long)seed % 0x7fffffff + (ulong)((ulong)(long)seed % 0x7fffffff == 0);
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)this,
             &wi->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
             &wo->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>,
             &args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>);
  this->isz_ = (int32_t)((wi->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->m_;
  this->osz_ = (int32_t)((wo->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->m_;
  this->hsz_ = ((args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->dim;
  this->negpos = 0;
  this->loss_ = 0.0;
  this->nexamples_ = 1;
  return;
}

Assistant:

Model::Model(std::shared_ptr<Matrix> wi,
             std::shared_ptr<Matrix> wo,
             std::shared_ptr<Args> args,
             int32_t seed)
  : hidden_(args->dim), output_(wo->m_), grad_(args->dim), rng(seed)
{
  //std::cout << "Seed: " << seed << std::endl;
  wi_ = wi;
  wo_ = wo;
  args_ = args;
  isz_ = wi->m_;
  osz_ = wo->m_;
  hsz_ = args->dim;
  negpos = 0;
  loss_ = 0.0;
  nexamples_ = 1;
}